

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

int ucnv_compareNames_63(char *name1,char *name2)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  
  bVar1 = false;
  bVar2 = false;
  do {
    bVar3 = *name1;
    name1 = (char *)((byte *)name1 + 1);
    if (bVar3 != 0) {
      bVar4 = !bVar1;
      do {
        if ((char)bVar3 < '\0') {
          bVar5 = 0;
        }
        else {
          bVar5 = ""[bVar3];
        }
        if (bVar5 != 0) {
          bVar1 = true;
          if (bVar5 != 1) {
            if (bVar5 != 2) {
              bVar1 = false;
              bVar3 = bVar5;
            }
            goto LAB_002b3eb0;
          }
          if (!bVar4) goto LAB_002b3eb0;
          if (((long)*name1 < 0) || (1 < ""[*name1] - 1)) break;
        }
        bVar3 = *name1;
        name1 = (char *)((byte *)name1 + 1);
        bVar4 = true;
      } while (bVar3 != 0);
      bVar1 = false;
    }
LAB_002b3eb0:
    bVar5 = *name2;
    name2 = (char *)((byte *)name2 + 1);
    if (bVar5 != 0) {
      bVar4 = !bVar2;
      do {
        if ((char)bVar5 < '\0') {
          bVar6 = 0;
        }
        else {
          bVar6 = ""[bVar5];
        }
        if (bVar6 != 0) {
          bVar2 = true;
          if (bVar6 != 1) {
            if (bVar6 != 2) {
              bVar2 = false;
              bVar5 = bVar6;
            }
            goto LAB_002b3f20;
          }
          if (!bVar4) goto LAB_002b3f20;
          if (((long)*name2 < 0) || (1 < ""[*name2] - 1)) break;
        }
        bVar5 = *name2;
        name2 = (char *)((byte *)name2 + 1);
        bVar4 = true;
      } while (bVar5 != 0);
      bVar2 = false;
    }
LAB_002b3f20:
    if (bVar5 == 0 && bVar3 == 0) {
      return 0;
    }
    if ((uint)bVar3 - (uint)bVar5 != 0) {
      return (uint)bVar3 - (uint)bVar5;
    }
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
ucnv_compareNames(const char *name1, const char *name2) {
    int rc;
    uint8_t type, nextType;
    char c1, c2;
    UBool afterDigit1 = FALSE, afterDigit2 = FALSE;

    for (;;) {
        while ((c1 = *name1++) != 0) {
            type = GET_CHAR_TYPE(c1);
            switch (type) {
            case UIGNORE:
                afterDigit1 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit1) {
                    nextType = GET_CHAR_TYPE(*name1);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit1 = TRUE;
                break;
            default:
                c1 = (char)type; /* lowercased letter */
                afterDigit1 = FALSE;
                break;
            }
            break; /* deliver c1 */
        }
        while ((c2 = *name2++) != 0) {
            type = GET_CHAR_TYPE(c2);
            switch (type) {
            case UIGNORE:
                afterDigit2 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit2) {
                    nextType = GET_CHAR_TYPE(*name2);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit2 = TRUE;
                break;
            default:
                c2 = (char)type; /* lowercased letter */
                afterDigit2 = FALSE;
                break;
            }
            break; /* deliver c2 */
        }

        /* If we reach the ends of both strings then they match */
        if ((c1|c2)==0) {
            return 0;
        }

        /* Case-insensitive comparison */
        rc = (int)(unsigned char)c1 - (int)(unsigned char)c2;
        if (rc != 0) {
            return rc;
        }
    }
}